

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_avg_8x8_quad_c(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  long lVar7;
  int k;
  long lVar8;
  uint8_t *puVar9;
  int i;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  lVar8 = 0;
  do {
    puVar9 = s + (long)(int)((y16_idx + ((uint)lVar8 & 2) * 4) * p) +
                 (long)(int)(x16_idx + ((uint)lVar8 & 1) * 8);
    iVar11 = 0;
    iVar10 = 0;
    do {
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      lVar7 = 0;
      do {
        uVar1 = *(undefined4 *)(puVar9 + lVar7);
        uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
        auVar2._8_4_ = 0;
        auVar2._0_8_ = uVar5;
        auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
        auVar3[8] = (char)((uint)uVar1 >> 0x10);
        auVar3._0_8_ = uVar5;
        auVar3[9] = 0;
        auVar3._10_3_ = auVar2._10_3_;
        auVar6._5_8_ = 0;
        auVar6._0_5_ = auVar3._8_5_;
        auVar4[4] = (char)((uint)uVar1 >> 8);
        auVar4._0_4_ = (int)uVar5;
        auVar4[5] = 0;
        auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
        iVar11 = iVar11 + (int)uVar5;
        iVar12 = iVar12 + auVar4._4_4_;
        iVar13 = iVar13 + auVar3._8_4_;
        iVar14 = iVar14 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 8);
      iVar11 = iVar14 + iVar12 + iVar13 + iVar11;
      iVar10 = iVar10 + 1;
      puVar9 = puVar9 + p;
    } while (iVar10 != 8);
    avg[lVar8] = iVar11 + 0x20 >> 6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  return;
}

Assistant:

void aom_avg_8x8_quad_c(const uint8_t *s, int p, int x16_idx, int y16_idx,
                        int *avg) {
  for (int k = 0; k < 4; k++) {
    const int x8_idx = x16_idx + ((k & 1) << 3);
    const int y8_idx = y16_idx + ((k >> 1) << 3);
    const uint8_t *s_tmp = s + y8_idx * p + x8_idx;
    avg[k] = aom_avg_8x8_c(s_tmp, p);
  }
}